

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_3x3.h
# Opt level: O0

void ncnn::conv3x3s1_winograd23_transform_kernel_sse(Mat *kernel,Mat *kernel_tm,int inch,int outch)

{
  int in_ECX;
  long lVar1;
  int in_EDX;
  Mat *in_RDI;
  int i_1;
  float *tmpp;
  int j;
  int i;
  float tmp [4] [3];
  float *k2;
  float *k1;
  float *k0;
  float *kernel_tm0;
  float *kernel0;
  int q;
  int p;
  float ktm [4] [3];
  Allocator *in_stack_fffffffffffffee0;
  Mat *this;
  Mat *in_stack_fffffffffffffee8;
  int in_stack_fffffffffffffef4;
  int iVar2;
  undefined8 in_stack_fffffffffffffef8;
  undefined4 in_stack_ffffffffffffff00;
  undefined4 in_stack_ffffffffffffff04;
  int iVar3;
  float local_f8 [12];
  float *local_c8;
  float *local_c0;
  float *local_b8;
  Mat local_a0;
  Mat *local_60;
  float *local_58;
  int local_50;
  int local_4c;
  float local_48 [12];
  int local_18;
  int local_14;
  Mat *local_8;
  
  local_18 = in_ECX;
  local_14 = in_EDX;
  local_8 = in_RDI;
  Mat::create((Mat *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
              (int)((ulong)in_stack_fffffffffffffef8 >> 0x20),(int)in_stack_fffffffffffffef8,
              in_stack_fffffffffffffef4,(size_t)in_stack_fffffffffffffee8,in_stack_fffffffffffffee0)
  ;
  memcpy(local_48,&DAT_001bbf00,0x30);
  for (local_4c = 0; local_4c < local_18; local_4c = local_4c + 1) {
    for (local_50 = 0; local_50 < local_14; local_50 = local_50 + 1) {
      local_58 = Mat::operator_cast_to_float_(local_8);
      local_58 = local_58 + (long)(local_4c * local_14 * 9) + (long)(local_50 * 9);
      this = &local_a0;
      Mat::channel(in_stack_fffffffffffffee8,(int)((ulong)this >> 0x20));
      in_stack_fffffffffffffee8 = (Mat *)Mat::row(this,local_50);
      Mat::~Mat((Mat *)0x136592);
      local_b8 = local_58;
      local_c0 = local_58 + 3;
      local_c8 = local_58 + 6;
      local_60 = in_stack_fffffffffffffee8;
      for (iVar3 = 0; iVar3 < 4; iVar3 = iVar3 + 1) {
        local_f8[(long)iVar3 * 3] =
             *local_b8 * local_48[(long)iVar3 * 3] + local_b8[1] * local_48[(long)iVar3 * 3 + 1] +
             local_b8[2] * local_48[(long)iVar3 * 3 + 2];
        local_f8[(long)iVar3 * 3 + 1] =
             *local_c0 * local_48[(long)iVar3 * 3] + local_c0[1] * local_48[(long)iVar3 * 3 + 1] +
             local_c0[2] * local_48[(long)iVar3 * 3 + 2];
        local_f8[(long)iVar3 * 3 + 2] =
             *local_c8 * local_48[(long)iVar3 * 3] + local_c8[1] * local_48[(long)iVar3 * 3 + 1] +
             local_c8[2] * local_48[(long)iVar3 * 3 + 2];
      }
      for (iVar3 = 0; iVar3 < 4; iVar3 = iVar3 + 1) {
        lVar1 = (long)iVar3;
        for (iVar2 = 0; iVar2 < 4; iVar2 = iVar2 + 1) {
          *(float *)((long)&local_60->data + (long)(iVar3 * 4 + iVar2) * 4) =
               local_f8[lVar1 * 3] * local_48[(long)iVar2 * 3] +
               local_f8[lVar1 * 3 + 1] * local_48[(long)iVar2 * 3 + 1] +
               local_f8[lVar1 * 3 + 2] * local_48[(long)iVar2 * 3 + 2];
        }
      }
    }
  }
  return;
}

Assistant:

static void conv3x3s1_winograd23_transform_kernel_sse(const Mat& kernel, Mat& kernel_tm, int inch, int outch)
{
    kernel_tm.create(4*4, inch, outch);

    // G
    const float ktm[4][3] = {
        {   1.0f,     0.0f,     0.0f},
        { 1.0f/2,   1.0f/2,   1.0f/2},
        { 1.0f/2,  -1.0f/2,   1.0f/2},
        {   0.0f,     0.0f,     1.0f}
    };

    #pragma omp parallel for
    for (int p = 0; p<outch; p++)
    {
        for (int q = 0; q<inch; q++)
        {
            const float* kernel0 = (const float*)kernel + p*inch * 9 + q * 9;
            float* kernel_tm0 = kernel_tm.channel(p).row(q);

            // transform kernel
            const float* k0 = kernel0;
            const float* k1 = kernel0 + 3;
            const float* k2 = kernel0 + 6;

            // h
            float tmp[4][3];
            for (int i=0; i<4; i++)
            {
                tmp[i][0] = k0[0] * ktm[i][0] + k0[1] * ktm[i][1] + k0[2] * ktm[i][2];
                tmp[i][1] = k1[0] * ktm[i][0] + k1[1] * ktm[i][1] + k1[2] * ktm[i][2];
                tmp[i][2] = k2[0] * ktm[i][0] + k2[1] * ktm[i][1] + k2[2] * ktm[i][2];
            }

            // U
            for (int j=0; j<4; j++)
            {
                float* tmpp = &tmp[j][0];

                for (int i=0; i<4; i++)
                {
                    kernel_tm0[j*4 + i] = tmpp[0] * ktm[i][0] + tmpp[1] * ktm[i][1] + tmpp[2] * ktm[i][2];
                }
            }
        }
    }
}